

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SMPTEAnalyzerResults::GenerateExportFile
          (SMPTEAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  char cVar1;
  uint uVar2;
  ulonglong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  char cVar7;
  ulonglong uVar8;
  Frame frame;
  ofstream file_stream;
  char str [128];
  char time_str [128];
  ulonglong local_388 [5];
  Frame local_360 [40];
  long local_338;
  filebuf local_330 [240];
  ios_base local_240 [264];
  char local_138 [128];
  char local_b8 [136];
  
  std::ofstream::ofstream(&local_338,file,_S_out);
  uVar3 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"# ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_338,"SMPTE/EBU Timecode (BiPhase Mark \'LTC\' 80 bits)",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338," / ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,"0.02 - 2011-08-19",0x11)
  ;
  std::ios::widen((char)(ostream *)&local_338 + (char)*(undefined8 *)(local_338 + -0x18));
  std::ostream::put((char)&local_338);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_338,"Time [s],SMPTE Timestamp HH:MM:SS.frame (flags)",0x2f);
  std::ios::widen((char)(ostream *)&local_338 + (char)*(undefined8 *)(local_338 + -0x18));
  cVar7 = (char)(ostream *)&local_338;
  std::ostream::put(cVar7);
  std::ostream::flush();
  uVar4 = AnalyzerResults::GetNumFrames();
  if (uVar4 != 0) {
    uVar8 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)local_388);
      AnalyzerHelpers::GetTimeString(local_388[0],uVar3,uVar2,local_b8,0x80);
      uVar5 = strlen(local_b8);
      while (uVar5 < 9) {
        sVar6 = strlen(local_b8);
        (local_b8 + sVar6)[0] = '0';
        (local_b8 + sVar6)[1] = '\0';
        uVar5 = strlen(local_b8);
      }
      Frame::Frame(local_360,(Frame *)local_388);
      fillSMPTE(this,local_360,local_138);
      Frame::~Frame(local_360);
      sVar6 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,local_b8,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,",",1);
      sVar6 = strlen(local_138);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_338,local_138,sVar6);
      std::ios::widen((char)*(undefined8 *)(local_338 + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar8);
      if (cVar1 != '\0') {
        std::ofstream::close();
        Frame::~Frame((Frame *)local_388);
        goto LAB_001058ba;
      }
      Frame::~Frame((Frame *)local_388);
      uVar8 = (ulonglong)((int)uVar8 + 1);
    } while (uVar8 < uVar4);
  }
  std::ofstream::close();
LAB_001058ba:
  local_338 = _VTT;
  *(undefined8 *)(local_330 + *(long *)(_VTT + -0x18) + -8) = _AddChannelBubblesWillAppearOn;
  std::filebuf::~filebuf(local_330);
  std::ios_base::~ios_base(local_240);
  return;
}

Assistant:

void SMPTEAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
	std::ofstream file_stream( file, std::ios::out );

	U64 trigger_sample = mAnalyzer->GetTriggerSample();
	U32 sample_rate = mAnalyzer->GetSampleRate();

	file_stream << "# " << TITLE << " / " << VERSION << std::endl;
	file_stream << "Time [s],SMPTE Timestamp HH:MM:SS.frame (flags)" << std::endl;

	U64 num_frames = GetNumFrames();
	for( U32 i=0; i < num_frames; i++ )
	{
		Frame frame = GetFrame( i );
		
		char time_str[128];
		AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

		while(strlen(time_str)<9)
			strcat(time_str,"0");

		char str[128];
	        fillSMPTE(frame,str);

		file_stream << time_str << "," << str << std::endl;

		if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
		{
			file_stream.close();
			return;
		}
	}

	file_stream.close();
}